

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::HelpFileName_abi_cxx11_(string_view str)

{
  string *in_RDI;
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)in_RDI,&local_20,&local_21);
  cmsys::SystemTools::ReplaceString(in_RDI,"<","");
  cmsys::SystemTools::ReplaceString(in_RDI,">","");
  return in_RDI;
}

Assistant:

std::string cmSystemTools::HelpFileName(cm::string_view str)
{
  std::string name(str);
  cmSystemTools::ReplaceString(name, "<", "");
  cmSystemTools::ReplaceString(name, ">", "");
  return name;
}